

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O2

size_t __thiscall
helics::ActionMessage::fromByteArray(ActionMessage *this,byte *data,size_t buffer_size)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  pointer pbVar4;
  uint8_t uVar5;
  undefined4 uVar6;
  int iVar7;
  size_t sVar8;
  long lVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  ulong uVar10;
  byte *pbVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  string_view data_00;
  uint32_t ssize;
  baseType timecode;
  undefined4 local_54;
  ulong local_50;
  InterfaceHandle *local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  Time local_38;
  
  if ((fromByteArray(std::byte_const*,unsigned_long)::littleEndian == '\0') &&
     (iVar7 = __cxa_guard_acquire(&fromByteArray(std::byte_const*,unsigned_long)::littleEndian),
     iVar7 != 0)) {
    fromByteArray::littleEndian = '\x01';
    __cxa_guard_release(&fromByteArray(std::byte_const*,unsigned_long)::littleEndian);
  }
  if (0x2c < buffer_size) {
    bVar1 = *data;
    if (bVar1 == 0xf3) {
      sVar8 = depacketize(this,data,buffer_size);
      if (sVar8 != 0) {
        return sVar8;
      }
      bVar1 = *data;
    }
    uVar5 = fromByteArray::littleEndian;
    if (bVar1 == 0x7b) {
      return 0;
    }
    local_50 = (ulong)((uint)data[2] << 8 | (uint)data[1] << 0x10);
    bVar2 = data[3];
    uVar12 = local_50 + bVar2 + 0x2d;
    if (uVar12 <= buffer_size) {
      uVar6 = *(undefined4 *)(data + 4);
      this->messageAction = uVar6;
      local_48 = (InterfaceHandle *)CONCAT71(local_48._1_7_,uVar5);
      if (bVar1 != uVar5) {
        swap_bytes<4ul>((uint8_t *)this);
        uVar6 = this->messageAction;
      }
      local_50 = local_50 | bVar2;
      this->messageID = *(undefined4 *)(data + 8);
      (this->source_id).gid = *(undefined4 *)(data + 0xc);
      (this->source_handle).hid = *(undefined4 *)(data + 0x10);
      (this->dest_id).gid = *(undefined4 *)(data + 0x14);
      (this->dest_handle).hid = *(undefined4 *)(data + 0x18);
      this->counter = *(undefined2 *)(data + 0x1c);
      this->flags = *(undefined2 *)(data + 0x1e);
      this->sequenceID = *(undefined4 *)(data + 0x20);
      (this->actionTime).internalTimeCode = *(undefined8 *)(data + 0x24);
      if (uVar6 == 500) {
        uVar12 = local_50 + 0x45;
        if (buffer_size < uVar12) goto LAB_002b72df;
        (this->Te).internalTimeCode = *(undefined8 *)(data + 0x2c);
        (this->Tdemin).internalTimeCode = *(undefined8 *)(data + 0x34);
        (this->Tso).internalTimeCode = *(undefined8 *)(data + 0x3c);
        pbVar11 = data + 0x44;
      }
      else {
        pbVar11 = data + 0x2c;
        this->Te = 0;
        this->Tdemin = 0;
        (this->Tso).internalTimeCode = 0;
      }
      if (local_50 != 0) {
        SmallBuffer::assign(&this->payload,pbVar11,local_50);
        pbVar11 = pbVar11 + local_50;
      }
      bVar2 = *pbVar11;
      uVar10 = (ulong)bVar2;
      this_00 = &this->stringData;
      if (uVar10 == 0) {
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize(this_00,uVar10);
        uVar12 = uVar12 + uVar10 * 4;
        if (buffer_size < uVar12) goto LAB_002b72df;
        pbVar11 = pbVar11 + 1;
        local_40 = this_00;
        for (lVar9 = 0; this_00 = local_40, (ulong)bVar2 * 0x20 != lVar9; lVar9 = lVar9 + 0x20) {
          local_54 = *(undefined4 *)pbVar11;
          if (bVar1 != (byte)local_48) {
            swap_bytes<4ul>((uint8_t *)&local_54);
          }
          uVar12 = uVar12 + (uint)local_54;
          if (buffer_size < uVar12) goto LAB_002b72df;
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(((((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_40->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )->_M_impl).super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar9
                 ),(char *)(pbVar11 + 4),(ulong)(uint)local_54);
          pbVar11 = pbVar11 + 4 + (uint)local_54;
        }
      }
      iVar7 = (int)local_50;
      if (bVar1 != (byte)local_48) {
        local_48 = &this->dest_handle;
        swap_bytes<4ul>((uint8_t *)&this->messageID);
        swap_bytes<4ul>((uint8_t *)&this->source_id);
        swap_bytes<4ul>((uint8_t *)&this->source_handle);
        swap_bytes<4ul>((uint8_t *)&this->dest_id);
        swap_bytes<4ul>((uint8_t *)local_48);
        uVar10._0_2_ = this->counter;
        uVar10._2_2_ = this->flags;
        uVar10._4_4_ = this->sequenceID;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = uVar10;
        auVar13 = psllw(auVar13,8);
        uVar3 = auVar13._0_4_ | CONCAT22((ushort)uVar10._2_2_ >> 8,(ushort)(undefined2)uVar10 >> 8);
        this->counter = (short)uVar3;
        this->flags = (short)(uVar3 >> 0x10);
        local_38.internalTimeCode = (this->actionTime).internalTimeCode;
        swap_bytes<8ul>((uint8_t *)&local_38);
        (this->actionTime).internalTimeCode = local_38.internalTimeCode;
        if (this->messageAction == cmd_time_request) {
          local_38.internalTimeCode = (this->Te).internalTimeCode;
          swap_bytes<8ul>((uint8_t *)&local_38);
          (this->Te).internalTimeCode = local_38.internalTimeCode;
          local_38.internalTimeCode = (this->Tdemin).internalTimeCode;
          swap_bytes<8ul>((uint8_t *)&local_38);
          (this->Tdemin).internalTimeCode = local_38.internalTimeCode;
          local_38.internalTimeCode = (this->Tso).internalTimeCode;
          swap_bytes<8ul>((uint8_t *)&local_38);
          (this->Tso).internalTimeCode = local_38.internalTimeCode;
        }
        iVar7 = (int)local_50;
      }
      if (iVar7 == 0xffffff) {
        pbVar4 = (this->stringData).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((this->stringData).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != pbVar4) {
          data_00._M_str = pbVar4[-1]._M_dataplus._M_p;
          data_00._M_len = pbVar4[-1]._M_string_length;
          SmallBuffer::append(&this->payload,data_00);
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this_00);
          return uVar12;
        }
        return uVar12;
      }
      return uVar12;
    }
  }
LAB_002b72df:
  this->messageAction = cmd_invalid;
  return 0;
}

Assistant:

std::size_t ActionMessage::fromByteArray(const std::byte* data, std::size_t buffer_size)
{
    std::size_t tsize{action_message_base_size};
    static const uint8_t littleEndian = isLittleEndian();
    if (buffer_size < tsize) {
        messageAction = CMD_INVALID;
        return (0);
    }
    if (data[0] == static_cast<std::byte>(LEADING_CHAR)) {
        auto res = depacketize(data, buffer_size);
        if (res > 0) {
            return static_cast<int>(res);
        }
    }
    // this means it probably is a JSON packate
    if (data[0] == std::byte{'{'}) {
        return 0;
    }
    const std::size_t size = 256ULL * 256ULL * (std::to_integer<std::size_t>(data[1])) +
        256ULL * std::to_integer<std::size_t>(data[2]) + std::to_integer<std::size_t>(data[3]);
    tsize += size;
    if (buffer_size < tsize) {
        messageAction = CMD_INVALID;
        return (0);
    }
    const bool swap = (data[0] != static_cast<std::byte>(littleEndian));
    data += sizeof(uint32_t);
    memcpy(&messageAction, data, sizeof(action_message_def::action_t));
    // messageAction = *reinterpret_cast<const action_message_def::action_t *> (data);
    if (swap) {
        swap_bytes<sizeof(action_message_def::action_t)>(
            reinterpret_cast<std::uint8_t*>(&messageAction));
    }
    data += sizeof(action_message_def::action_t);
    // messageID = *reinterpret_cast<const int32_t *> (data);
    memcpy(&messageID, data, sizeof(int32_t));
    data += sizeof(int32_t);
    // source_id = GlobalFederateId{*reinterpret_cast<const int32_t *> (data)};
    memcpy(source_id.getBaseTypePointer(), data, sizeof(GlobalFederateId::BaseType));
    data += sizeof(GlobalFederateId);
    // source_handle = InterfaceHandle{*reinterpret_cast<const int32_t *> (data)};
    memcpy(source_handle.getBaseTypePointer(), data, sizeof(InterfaceHandle::BaseType));
    data += sizeof(InterfaceHandle);
    // dest_id = GlobalFederateId{*reinterpret_cast<const int32_t *> (data)};
    memcpy(dest_id.getBaseTypePointer(), data, sizeof(GlobalFederateId::BaseType));
    data += sizeof(GlobalFederateId);
    // dest_handle = InterfaceHandle{*reinterpret_cast<const int32_t *> (data)};
    memcpy(dest_handle.getBaseTypePointer(), data, sizeof(InterfaceHandle::BaseType));
    data += sizeof(InterfaceHandle);
    // counter = *reinterpret_cast<const uint16_t *> (data);
    memcpy(&counter, data, sizeof(uint16_t));
    data += sizeof(uint16_t);
    // flags = *reinterpret_cast<const uint16_t *> (data);
    memcpy(&flags, data, sizeof(uint16_t));
    data += sizeof(uint16_t);
    // sequenceID = *reinterpret_cast<const uint32_t *> (data);
    memcpy(&sequenceID, data, sizeof(uint32_t));
    data += sizeof(uint32_t);
    Time::baseType btc;
    memcpy(&btc, data, sizeof(Time::baseType));
    actionTime.setBaseTimeCode(btc);
    data += sizeof(Time::baseType);

    if (messageAction == CMD_TIME_REQUEST) {
        tsize += 3 * sizeof(Time::baseType);
        if (buffer_size < tsize) {
            messageAction = CMD_INVALID;
            return (0);
        }
        memcpy(&btc, data, sizeof(Time::baseType));
        Te.setBaseTimeCode(btc);
        data += sizeof(Time::baseType);
        memcpy(&btc, data, sizeof(Time::baseType));
        Tdemin.setBaseTimeCode(btc);
        data += sizeof(Time::baseType);
        memcpy(&btc, data, sizeof(Time::baseType));
        Tso.setBaseTimeCode(btc);
        data += sizeof(Time::baseType);
    } else {
        Te = timeZero;
        Tdemin = timeZero;
        Tso = timeZero;
    }
    if (size > 0) {
        payload.assign(data, size);
        data += size;
    }
    auto stringCount = std::to_integer<std::size_t>(*data);
    ++data;
    if (stringCount != 0) {
        stringData.resize(stringCount);
        tsize += 4 * stringCount;
        if (buffer_size < tsize) {
            messageAction = CMD_INVALID;
            return (0);
        }

        for (std::size_t ii = 0; ii < stringCount; ++ii) {
            uint32_t ssize;
            memcpy(&ssize, data, sizeof(uint32_t));
            data += sizeof(uint32_t);
            if (swap) {
                swap_bytes<4>(reinterpret_cast<std::uint8_t*>(&ssize));
            }
            tsize += ssize;
            if (buffer_size < tsize) {
                messageAction = CMD_INVALID;
                return (0);
            }
            stringData[ii].assign(reinterpret_cast<const char*>(data), ssize);
            data += ssize;
        }
    } else {
        stringData.clear();
    }

    if (swap) {
        swap_bytes<4>(reinterpret_cast<std::uint8_t*>(&messageID));
        swap_bytes<4>(reinterpret_cast<std::uint8_t*>(&source_id));
        swap_bytes<4>(reinterpret_cast<std::uint8_t*>(&source_handle));
        swap_bytes<4>(reinterpret_cast<std::uint8_t*>(&dest_id));
        swap_bytes<4>(reinterpret_cast<std::uint8_t*>(&dest_handle));
        swap_bytes<2>(reinterpret_cast<std::uint8_t*>(&counter));
        swap_bytes<2>(reinterpret_cast<std::uint8_t*>(&flags));
        auto timecode = actionTime.getBaseTimeCode();
        swap_bytes<sizeof(Time::baseType)>(reinterpret_cast<std::uint8_t*>(&timecode));
        actionTime.setBaseTimeCode(timecode);
        if (messageAction == CMD_TIME_REQUEST) {
            timecode = Te.getBaseTimeCode();
            swap_bytes<sizeof(Time::baseType)>(reinterpret_cast<std::uint8_t*>(&timecode));
            Te.setBaseTimeCode(timecode);
            timecode = Tdemin.getBaseTimeCode();
            swap_bytes<sizeof(Time::baseType)>(reinterpret_cast<std::uint8_t*>(&timecode));
            Tdemin.setBaseTimeCode(timecode);
            timecode = Tso.getBaseTimeCode();
            swap_bytes<sizeof(Time::baseType)>(reinterpret_cast<std::uint8_t*>(&timecode));
            Tso.setBaseTimeCode(timecode);
        }
    }
    if (size == maxPayloadSize && !stringData.empty()) {
        payload.append(stringData.back());
        stringData.pop_back();
    }
    return tsize;
}